

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

void helper_vmsumshs_ppc64
               (CPUPPCState_conflict2 *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,ppc_avr_t *c)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  int aiStack_48 [8];
  int32_t prod [8];
  
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    aiStack_48[lVar2] = (int)b->s16[lVar2] * (int)a->s16[lVar2];
  }
  bVar1 = false;
  uVar4 = 7;
  for (uVar3 = 3; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    lVar5 = (long)aiStack_48[uVar4] + (long)aiStack_48[uVar4 - 1] + (long)c->s32[uVar3];
    lVar2 = 0x7fffffff;
    if (lVar5 < 0x7fffffff) {
      lVar2 = lVar5;
    }
    if ((int)lVar5 != lVar5) {
      bVar1 = true;
    }
    if (lVar2 < -0x7fffffff) {
      lVar2 = -0x80000000;
    }
    r->u32[uVar3] = (uint32_t)lVar2;
    uVar4 = uVar4 - 2;
  }
  if (bVar1) {
    (env->vscr_sat).u32[0] = 1;
  }
  return;
}

Assistant:

void helper_vmsumshs(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a,
                     ppc_avr_t *b, ppc_avr_t *c)
{
    int32_t prod[8];
    int i;
    int sat = 0;

    for (i = 0; i < ARRAY_SIZE(r->s16); i++) {
        prod[i] = (int32_t)a->s16[i] * b->s16[i];
    }

    VECTOR_FOR_INORDER_I(i, s32) {
        int64_t t = (int64_t)c->s32[i] + prod[2 * i] + prod[2 * i + 1];

        r->u32[i] = cvtsdsw(t, &sat);
    }

    if (sat) {
        set_vscr_sat(env);
    }
}